

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::Bound_Function::Bound_Function
          (Bound_Function *this,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  int iVar1;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_50;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_38;
  
  build_param_type_info
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_50,t_f,
             t_args);
  if (((t_f->
       super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->m_arity < 0) {
    Proxy_Function_Base::Proxy_Function_Base
              (&this->super_Proxy_Function_Base,
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_50,-1
              );
  }
  else {
    build_param_type_info
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_38,
               t_f,t_args);
    Proxy_Function_Base::Proxy_Function_Base
              (&this->super_Proxy_Function_Base,
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_50,
               (int)(((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_38._M_impl.super__Vector_impl_data._M_start) / 0x18) + -1);
    Catch::clara::std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
    ~_Vector_base(&local_38);
  }
  Catch::clara::std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
  ~_Vector_base(&local_50);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Bound_Function_006a1e80;
  Catch::clara::std::
  __shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->m_f).
                super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ,&t_f->
                 super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              );
  Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
  vector(&this->m_args,t_args);
  iVar1 = ((this->m_f).
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->m_arity;
  if ((-1 < iVar1) &&
     (iVar1 != (int)((ulong)((long)(this->m_args).
                                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_args).
                                  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    __assert_fail("m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                  ,0x1be,
                  "chaiscript::dispatch::Bound_Function::Bound_Function(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                 );
  }
  return;
}

Assistant:

Bound_Function(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args)
          : Proxy_Function_Base(build_param_type_info(t_f, t_args),
                                (t_f->get_arity() < 0 ? -1 : static_cast<int>(build_param_type_info(t_f, t_args).size()) - 1))
          , m_f(t_f)
          , m_args(t_args) {
        assert(m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size()));
      }